

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O1

FT_Error sdf_generate_with_overlaps
                   (SDF_Params internal_params,SDF_Shape *shape,FT_UInt spread,FT_Bitmap *bitmap)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  SDF_Edge_Type SVar4;
  SDF_Contour *pSVar5;
  SDF_Contour_ *pSVar6;
  FT_Pointer pvVar7;
  byte bVar8;
  byte bVar9;
  uint uVar10;
  FT_Error FVar11;
  FT_Pointer pvVar12;
  FT_Pointer pvVar13;
  SDF_Edge *pSVar14;
  SDF_Contour *pSVar15;
  undefined4 uVar16;
  undefined4 in_register_0000000c;
  uint *puVar17;
  long lVar18;
  SDF_Contour_ **ppSVar19;
  long *plVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  byte bVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  byte bVar32;
  FT_Memory memory;
  SDF_Params internal_params_00;
  FT_Error error;
  SDF_Shape temp_shape;
  FT_Error local_ac;
  FT_Memory local_a8;
  FT_UInt local_9c;
  ulong local_98;
  SDF_Contour_ **local_90;
  ulong local_88;
  FT_Pointer local_80;
  uint local_74;
  uint *local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  SDF_Contour *local_50;
  FT_Bitmap *local_48;
  SDF_Shape local_40;
  
  puVar17 = (uint *)CONCAT44(in_register_0000000c,spread);
  local_90 = (SDF_Contour_ **)
             CONCAT44((int)((ulong)register0x00000030 >> 0x20),internal_params.overload_sign);
  local_98 = internal_params._0_8_;
  local_ac = 0;
  FVar11 = 6;
  if ((puVar17 != (uint *)0x0 && local_90 != (SDF_Contour_ **)0x0) &&
     (memory = (FT_Memory)*local_90, memory != (FT_Memory)0x0)) {
    lVar26 = (long)local_90[1];
    local_9c = (FT_UInt)shape;
    if (lVar26 == 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      do {
        uVar10 = uVar10 + 1;
        lVar26 = *(long *)(lVar26 + 0x18);
      } while (lVar26 != 0);
    }
    uVar2 = puVar17[1];
    uVar3 = *puVar17;
    uVar31 = (ulong)uVar10;
    local_58 = uVar31 * 0x28;
    local_40.memory = memory;
    local_80 = ft_mem_alloc(memory,local_58,&local_ac);
    if (local_ac == 0) {
      local_70 = puVar17;
      pvVar12 = ft_mem_alloc(memory,uVar31 * 4,&local_ac);
      if (local_ac == 0) {
        ppSVar19 = local_90 + 1;
        local_a8 = memory;
        local_90 = ppSVar19;
        local_68 = (ulong)uVar3;
        if (uVar31 == 0) {
          pSVar15 = (SDF_Contour *)0x0;
          uVar23 = local_98;
        }
        else {
          local_60 = local_98 & 0xffffff00ffffffff;
          uVar27 = 0;
          local_74 = (uint)local_98 ^ 1;
          pSVar15 = (SDF_Contour *)0x0;
          do {
            pvVar7 = local_80;
            pSVar5 = *ppSVar19;
            local_48 = (FT_Bitmap *)(uVar27 * 0x28 + (long)local_80);
            local_88 = uVar27;
            local_50 = pSVar15;
            FT_Bitmap_Init(local_48);
            *(uint *)((long)pvVar7 + uVar27 * 0x28 + 4) = local_70[1];
            *(uint *)((long)pvVar7 + uVar27 * 0x28) = *local_70;
            *(uint *)((long)pvVar7 + uVar27 * 0x28 + 8) = local_70[2];
            *(short *)((long)pvVar7 + uVar27 * 0x28 + 0x18) = (short)local_70[6];
            *(undefined1 *)((long)pvVar7 + uVar27 * 0x28 + 0x1a) =
                 *(undefined1 *)((long)local_70 + 0x1a);
            pvVar13 = ft_mem_alloc(local_a8,(ulong)(local_70[2] * *local_70),&local_ac);
            uVar23 = local_98;
            *(FT_Pointer *)((long)pvVar7 + uVar27 * 0x28 + 0x10) = pvVar13;
            memory = local_a8;
            if (local_ac != 0) goto LAB_00242b49;
            iVar29 = 0;
            if ((pSVar5 != (SDF_Contour *)0x0) &&
               (pSVar14 = pSVar5->edges, iVar29 = 0, pSVar14 != (SDF_Edge *)0x0)) {
              iVar29 = 0;
              do {
                SVar4 = pSVar14->edge_type;
                if (SVar4 == SDF_EDGE_CUBIC) {
                  lVar26 = (pSVar14->control_a).x;
                  lVar21 = (pSVar14->control_a).y;
                  uVar25 = ((pSVar14->start_pos).y + lVar21) * (lVar26 - (pSVar14->start_pos).x);
                  uVar27 = uVar25 + 0x3f;
                  if (-1 < (long)uVar25) {
                    uVar27 = uVar25;
                  }
                  lVar18 = (pSVar14->control_b).x;
                  lVar24 = (pSVar14->control_b).y;
                  uVar30 = (lVar21 + lVar24) * (lVar18 - lVar26);
                  uVar25 = uVar30 + 0x3f;
                  if (-1 < (long)uVar30) {
                    uVar25 = uVar30;
                  }
                  iVar29 = (int)(uVar25 >> 6) + iVar29 + (int)(uVar27 >> 6);
                  lVar18 = (pSVar14->end_pos).x - lVar18;
                  lVar26 = 0x18;
                }
                else if (SVar4 == SDF_EDGE_CONIC) {
                  lVar18 = (pSVar14->control_a).x;
                  lVar24 = (pSVar14->control_a).y;
                  uVar25 = ((pSVar14->start_pos).y + lVar24) * (lVar18 - (pSVar14->start_pos).x);
                  uVar27 = uVar25 + 0x3f;
                  if (-1 < (long)uVar25) {
                    uVar27 = uVar25;
                  }
                  iVar29 = iVar29 + (int)(uVar27 >> 6);
                  lVar18 = (pSVar14->end_pos).x - lVar18;
                  lVar26 = 0x18;
                }
                else {
                  if (SVar4 != SDF_EDGE_LINE) {
                    iVar29 = 0;
                    goto LAB_002429c4;
                  }
                  lVar24 = (pSVar14->end_pos).y;
                  lVar18 = (pSVar14->end_pos).x - (pSVar14->start_pos).x;
                  lVar26 = 8;
                }
                uVar25 = (lVar24 + *(long *)((long)&(pSVar14->start_pos).x + lVar26)) * lVar18;
                uVar27 = uVar25 + 0x3f;
                if (-1 < (long)uVar25) {
                  uVar27 = uVar25;
                }
                iVar29 = (int)(uVar27 >> 6) + iVar29;
                pSVar14 = pSVar14->next;
              } while (pSVar14 != (SDF_Edge_ *)0x0);
              iVar29 = (iVar29 < 1) + 1;
            }
LAB_002429c4:
            *(int *)((long)pvVar12 + local_88 * 4) = iVar29;
            iVar22 = (int)local_98;
            pSVar6 = pSVar5->next;
            pSVar5->next = (SDF_Contour_ *)0x0;
            internal_params_00.overload_sign._0_1_ =
                 iVar29 == 1 && local_74 == 0 || iVar29 == 2 && iVar22 == 0;
            internal_params_00.orientation = (undefined4)local_60;
            internal_params_00.flip_sign = local_60._4_1_;
            internal_params_00.flip_y = local_60._5_1_;
            internal_params_00._6_2_ = local_60._6_2_;
            internal_params_00.overload_sign._1_3_ = 0;
            local_40.contours = pSVar5;
            local_ac = sdf_generate_subdivision(internal_params_00,&local_40,local_9c,local_48);
            memory = local_a8;
            if (local_ac != 0) goto LAB_00242b49;
            ppSVar19 = &pSVar5->next;
            *ppSVar19 = pSVar6;
            (local_40.contours)->next = local_50;
            if (iVar22 == 1) {
              iVar29 = *(int *)((long)pvVar12 + local_88 * 4);
              if (iVar29 == 1) {
                uVar16 = 2;
              }
              else {
                if (iVar29 != 2) goto LAB_00242a58;
                uVar16 = 1;
              }
              *(undefined4 *)((long)pvVar12 + local_88 * 4) = uVar16;
            }
LAB_00242a58:
            uVar27 = local_88 + 1;
            pSVar15 = local_40.contours;
          } while (uVar27 != uVar31);
        }
        *local_90 = pSVar15;
        memory = local_a8;
        if (0 < (int)local_68) {
          lVar26 = *(long *)(local_70 + 4);
          uVar27 = 0;
          do {
            if (0 < (int)uVar2) {
              uVar25 = 0;
              do {
                lVar21 = uVar25 + uVar27 * uVar2;
                if (uVar31 == 0) {
                  bVar32 = 0;
                  bVar28 = 0xff;
                }
                else {
                  bVar28 = 0xff;
                  uVar30 = 0;
                  bVar32 = 0;
                  plVar20 = (long *)((long)local_80 + 0x10);
                  do {
                    bVar1 = *(byte *)(*plVar20 + lVar21);
                    bVar8 = bVar32;
                    bVar9 = bVar28;
                    if (*(int *)((long)pvVar12 + uVar30 * 4) == 1) {
                      bVar8 = bVar1;
                      if (bVar1 < bVar32) {
                        bVar8 = bVar32;
                      }
                    }
                    else {
                      bVar9 = bVar1;
                      if (bVar28 < bVar1) {
                        bVar9 = bVar28;
                      }
                    }
                    bVar28 = bVar9;
                    bVar32 = bVar8;
                    uVar30 = uVar30 + 1;
                    plVar20 = plVar20 + 5;
                  } while (uVar31 != uVar30);
                }
                if (bVar32 < bVar28) {
                  bVar28 = bVar32;
                }
                *(byte *)(lVar26 + lVar21) = bVar28 ^ -((uVar23 & 0xff00000000) != 0);
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar2);
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != local_68);
        }
      }
    }
    else {
      pvVar12 = (void *)0x0;
    }
LAB_00242b49:
    if (pvVar12 != (void *)0x0) {
      ft_mem_free(memory,pvVar12);
    }
    lVar26 = local_58;
    pvVar12 = local_80;
    FVar11 = local_ac;
    if (local_80 != (void *)0x0) {
      if (uVar31 == 0) {
        local_ac = 0x61;
        FVar11 = local_ac;
      }
      else {
        lVar21 = 0;
        do {
          ft_mem_free(memory,*(void **)((long)pvVar12 + lVar21 + 0x10));
          *(undefined8 *)((long)pvVar12 + lVar21 + 0x10) = 0;
          lVar21 = lVar21 + 0x28;
        } while (lVar26 != lVar21);
        ft_mem_free(memory,pvVar12);
        FVar11 = local_ac;
      }
    }
  }
  return FVar11;
}

Assistant:

static FT_Error
  sdf_generate_with_overlaps( SDF_Params        internal_params,
                              SDF_Shape*        shape,
                              FT_UInt           spread,
                              const FT_Bitmap*  bitmap )
  {
    FT_Error  error = FT_Err_Ok;

    FT_Int      num_contours;        /* total number of contours      */
    FT_Int      i, j;                /* iterators                     */
    FT_Int      width, rows;         /* width and rows of the bitmap  */
    FT_Bitmap*  bitmaps;             /* separate bitmaps for contours */

    SDF_Contour*  contour;           /* temporary variable to iterate */
    SDF_Contour*  temp_contour;      /* temporary contour             */
    SDF_Contour*  head;              /* head of the contour list      */
    SDF_Shape     temp_shape;        /* temporary shape               */

    FT_Memory      memory;           /* to allocate memory            */
    FT_SDFFormat*  t;                /* target bitmap buffer          */
    FT_Bool        flip_sign;        /* flip sign?                    */

    /* orientation of all the separate contours */
    SDF_Contour_Orientation*  orientations;


    bitmaps      = NULL;
    orientations = NULL;
    head         = NULL;

    if ( !shape || !bitmap || !shape->memory )
      return FT_THROW( Invalid_Argument );

    /* Disable `flip_sign` to avoid extra complication */
    /* during the combination phase.                   */
    flip_sign                 = internal_params.flip_sign;
    internal_params.flip_sign = 0;

    contour           = shape->contours;
    memory            = shape->memory;
    temp_shape.memory = memory;
    width             = (FT_Int)bitmap->width;
    rows              = (FT_Int)bitmap->rows;
    num_contours      = 0;

    /* find the number of contours in the shape */
    while ( contour )
    {
      num_contours++;
      contour = contour->next;
    }

    /* allocate the bitmaps to generate SDF for separate contours */
    if ( FT_ALLOC( bitmaps,
                   (FT_UInt)num_contours * sizeof ( *bitmaps ) ) )
      goto Exit;

    /* allocate array to hold orientation for all contours */
    if ( FT_ALLOC( orientations,
                   (FT_UInt)num_contours * sizeof ( *orientations ) ) )
      goto Exit;

    contour = shape->contours;

    /* Iterate over all contours and generate SDF separately. */
    for ( i = 0; i < num_contours; i++ )
    {
      /* initialize the corresponding bitmap */
      FT_Bitmap_Init( &bitmaps[i] );

      bitmaps[i].width      = bitmap->width;
      bitmaps[i].rows       = bitmap->rows;
      bitmaps[i].pitch      = bitmap->pitch;
      bitmaps[i].num_grays  = bitmap->num_grays;
      bitmaps[i].pixel_mode = bitmap->pixel_mode;

      /* allocate memory for the buffer */
      if ( FT_ALLOC( bitmaps[i].buffer,
                     bitmap->rows * (FT_UInt)bitmap->pitch ) )
        goto Exit;

      /* determine the orientation */
      orientations[i] = get_contour_orientation( contour );

      /* The `overload_sign` property is specific to  */
      /* `sdf_generate_bounding_box`.  This basically */
      /* overloads the default sign of the outside    */
      /* pixels, which is necessary for               */
      /* counter-clockwise contours.                  */
      if ( orientations[i] == SDF_ORIENTATION_CCW                   &&
           internal_params.orientation == FT_ORIENTATION_FILL_RIGHT )
        internal_params.overload_sign = 1;
      else if ( orientations[i] == SDF_ORIENTATION_CW                   &&
                internal_params.orientation == FT_ORIENTATION_FILL_LEFT )
        internal_params.overload_sign = 1;
      else
        internal_params.overload_sign = 0;

      /* Make `contour->next` NULL so that there is   */
      /* one contour in the list.  Also hold the next */
      /* contour in a temporary variable so as to     */
      /* restore the original value.                  */
      temp_contour  = contour->next;
      contour->next = NULL;

      /* Use `temp_shape` to hold the new contour. */
      /* Now, `temp_shape` has only one contour.   */
      temp_shape.contours = contour;

      /* finally generate the SDF */
      FT_CALL( sdf_generate_subdivision( internal_params,
                                         &temp_shape,
                                         spread,
                                         &bitmaps[i] ) );

      /* Restore the original `next` variable. */
      contour->next = temp_contour;

      /* Since `split_sdf_shape` deallocated the original */
      /* contours list we need to assign the new value to */
      /* the shape's contour.                             */
      temp_shape.contours->next = head;
      head                      = temp_shape.contours;

      /* Simply flip the orientation in case of post-script fonts */
      /* so as to avoid modificatons in the combining phase.      */
      if ( internal_params.orientation == FT_ORIENTATION_FILL_LEFT )
      {
        if ( orientations[i] == SDF_ORIENTATION_CW )
          orientations[i] = SDF_ORIENTATION_CCW;
        else if ( orientations[i] == SDF_ORIENTATION_CCW )
          orientations[i] = SDF_ORIENTATION_CW;
      }

      contour = contour->next;
    }

    /* assign the new contour list to `shape->contours` */
    shape->contours = head;

    /* cast the output bitmap buffer */
    t = (FT_SDFFormat*)bitmap->buffer;

    /* Iterate over all pixels and combine all separate    */
    /* contours.  These are the rules for combining:       */
    /*                                                     */
    /* (1) For all clockwise contours, compute the largest */
    /*     value.  Name this as `val_c`.                   */
    /* (2) For all counter-clockwise contours, compute the */
    /*     smallest value.  Name this as `val_ac`.         */
    /* (3) Now, finally use the smaller value of `val_c'   */
    /*     and `val_ac'.                                   */
    for ( j = 0; j < rows; j++ )
    {
      for ( i = 0; i < width; i++ )
      {
        FT_Int  id = j * width + i;       /* index of current pixel    */
        FT_Int  c;                        /* contour iterator          */

        FT_SDFFormat  val_c  = 0;         /* max clockwise value       */
        FT_SDFFormat  val_ac = UCHAR_MAX; /* min counter-clockwise val */


        /* iterate through all the contours */
        for ( c = 0; c < num_contours; c++ )
        {
          /* current contour value */
          FT_SDFFormat  temp = ( (FT_SDFFormat*)bitmaps[c].buffer )[id];


          if ( orientations[c] == SDF_ORIENTATION_CW )
            val_c = FT_MAX( val_c, temp );   /* clockwise         */
          else
            val_ac = FT_MIN( val_ac, temp ); /* counter-clockwise */
        }

        /* Finally find the smaller of the two and assign to output. */
        /* Also apply `flip_sign` if set.                            */
        t[id] = FT_MIN( val_c, val_ac );

        if ( flip_sign )
          t[id] = invert_sign( t[id] );
      }
    }

  Exit:
    /* deallocate orientations array */
    if ( orientations )
      FT_FREE( orientations );

    /* deallocate temporary bitmaps */
    if ( bitmaps )
    {
      if ( num_contours == 0 )
        error = FT_THROW( Raster_Corrupted );
      else
      {
        for ( i = 0; i < num_contours; i++ )
          FT_FREE( bitmaps[i].buffer );

        FT_FREE( bitmaps );
      }
    }

    /* restore the `flip_sign` property */
    internal_params.flip_sign = flip_sign;

    return error;
  }